

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O0

void __thiscall lsim::Simulator::node_set_initial_value(Simulator *this,node_t node_id,Value value)

{
  value_type vVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  Value value_local;
  node_t node_id_local;
  Simulator *this_local;
  
  sVar2 = std::vector<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>::size
                    (&this->m_node_metadata);
  if (node_id < sVar2) {
    pvVar3 = std::vector<lsim::Value,_std::allocator<lsim::Value>_>::operator[]
                       (&this->m_node_values_read,(ulong)node_id);
    *pvVar3 = value;
    pvVar3 = std::vector<lsim::Value,_std::allocator<lsim::Value>_>::operator[]
                       (&this->m_node_values_write,(ulong)node_id);
    *pvVar3 = value;
    vVar1 = this->m_time;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_node_write_time,(ulong)node_id);
    *pvVar4 = vVar1;
    vVar1 = this->m_time;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_node_change_time,(ulong)node_id);
    *pvVar4 = vVar1;
    return;
  }
  __assert_fail("node_id < m_node_metadata.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                ,0xd0,"void lsim::Simulator::node_set_initial_value(node_t, Value)");
}

Assistant:

void Simulator::node_set_initial_value(node_t node_id, Value value) {
    assert(node_id < m_node_metadata.size());
    m_node_values_read[node_id] = value;
    m_node_values_write[node_id] = value;
    m_node_write_time[node_id] = m_time;
    m_node_change_time[node_id] = m_time;
}